

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CDict *
ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  ZSTD_compressionParameters ZVar1;
  ZSTD_CDict *pZVar2;
  undefined1 local_d0 [8];
  ZSTD_CCtx_params cctxParams;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dictBuffer_local;
  
  ZVar1 = cParams;
  cctxParams.customMem.opaque._0_4_ = dictContentType;
  cctxParams.customMem.opaque._4_4_ = dictLoadMethod;
  memset(local_d0,0,0xb0);
  ZSTD_CCtxParams_init((ZSTD_CCtx_params *)local_d0,0);
  local_d0._4_4_ = cParams.windowLog;
  unique0x00012004 = cParams.chainLog;
  cParams._8_8_ = ZVar1._8_8_;
  cctxParams.cParams.windowLog = cParams.hashLog;
  cctxParams.cParams.chainLog = cParams.searchLog;
  cParams._16_8_ = ZVar1._16_8_;
  cctxParams.cParams.hashLog = cParams.minMatch;
  cctxParams.cParams.searchLog = cParams.targetLength;
  cParams.strategy = ZVar1.strategy;
  cctxParams.cParams.minMatch = cParams.strategy;
  cctxParams._144_8_ = customMem.customAlloc;
  cctxParams.customMem.customAlloc = (ZSTD_allocFunction)customMem.customFree;
  cctxParams.customMem.customFree = (ZSTD_freeFunction)customMem.opaque;
  pZVar2 = ZSTD_createCDict_advanced2
                     (dictBuffer,dictSize,cctxParams.customMem.opaque._4_4_,
                      (ZSTD_dictContentType_e)cctxParams.customMem.opaque,
                      (ZSTD_CCtx_params *)local_d0,customMem);
  return pZVar2;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams,
                                      ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams;
    ZSTD_memset(&cctxParams, 0, sizeof(cctxParams));
    ZSTD_CCtxParams_init(&cctxParams, 0);
    cctxParams.cParams = cParams;
    cctxParams.customMem = customMem;
    return ZSTD_createCDict_advanced2(
        dictBuffer, dictSize,
        dictLoadMethod, dictContentType,
        &cctxParams, customMem);
}